

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey
          (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this,FModelVertex key)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  
  while( true ) {
    pNVar5 = MainPosition(this,key);
    if (pNVar5->Next == (Node *)0x1) break;
    pNVar6 = GetFreePos(this);
    if (pNVar6 != (Node *)0x0) {
      pNVar7 = MainPosition(this,(pNVar5->Pair).Key);
      if (pNVar7 != pNVar5) goto LAB_00417f44;
      pNVar6->Next = pNVar5->Next;
      pNVar7 = pNVar6;
      goto LAB_00417f6a;
    }
    Rehash(this);
  }
LAB_00417f64:
  pNVar6 = pNVar5;
  pNVar7 = (Node *)0x0;
LAB_00417f6a:
  pNVar5->Next = pNVar7;
  this->NumUsed = this->NumUsed + 1;
  (pNVar6->Pair).Key.v = key.v;
  (pNVar6->Pair).Key.x = key.x;
  (pNVar6->Pair).Key.y = key.y;
  (pNVar6->Pair).Key.z = key.z;
  (pNVar6->Pair).Key.u = key.u;
  return pNVar6;
LAB_00417f44:
  do {
    pNVar8 = pNVar7;
    pNVar7 = pNVar8->Next;
  } while (pNVar7 != pNVar5);
  pNVar8->Next = pNVar6;
  pNVar7 = pNVar5->Next;
  fVar3 = (pNVar5->Pair).Key.x;
  fVar4 = (pNVar5->Pair).Key.y;
  fVar2 = (pNVar5->Pair).Key.u;
  uVar1 = *(undefined8 *)&(pNVar5->Pair).Key.v;
  (pNVar6->Pair).Key.z = (pNVar5->Pair).Key.z;
  (pNVar6->Pair).Key.u = fVar2;
  *(undefined8 *)&(pNVar6->Pair).Key.v = uVar1;
  pNVar6->Next = pNVar7;
  (pNVar6->Pair).Key.x = fVar3;
  (pNVar6->Pair).Key.y = fVar4;
  goto LAB_00417f64;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}